

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uchar uVar2;
  long lVar3;
  ssize_t sVar4;
  unique_ptr<yb::HistorySuggestion,_std::default_delete<yb::HistorySuggestion>_> *this;
  type history;
  unique_ptr<yb::Printer,_std::default_delete<yb::Printer>_> *this_00;
  type printer;
  LineBuffer *buffer;
  PrintBuffer *pPVar5;
  unique_ptr<yb::ArrowHandler,_std::default_delete<yb::ArrowHandler>_> *this_01;
  type arrowHandler;
  ssize_t returnValue;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  bVar1 = anon_unknown.dwarf_64f5::is_terminal_input(__fd);
  if (bVar1) {
    pPVar5 = (PrintBuffer *)_ZTWN12_GLOBAL__N_111printBufferE();
    bVar1 = yb::PrintBuffer::empty(pPVar5);
    if (!bVar1) {
      anon_unknown.dwarf_64f5::putCharToReadBuffer((char *)__buf);
      return 1;
    }
  }
  lVar3 = __tls_get_addr(&PTR_00136ee0);
  sVar4 = (**(code **)(lVar3 + 0x78))(__fd,__buf,__nbytes);
  bVar1 = anon_unknown.dwarf_64f5::is_terminal_input(__fd);
  if (bVar1) {
    this = (unique_ptr<yb::HistorySuggestion,_std::default_delete<yb::HistorySuggestion>_> *)
           _ZTWN12_GLOBAL__N_117historySuggestionE();
    history = std::unique_ptr<yb::HistorySuggestion,_std::default_delete<yb::HistorySuggestion>_>::
              operator*(this);
    this_00 = (unique_ptr<yb::Printer,_std::default_delete<yb::Printer>_> *)
              _ZTWN12_GLOBAL__N_17printerE();
    printer = std::unique_ptr<yb::Printer,_std::default_delete<yb::Printer>_>::operator*(this_00);
    buffer = (LineBuffer *)_ZTWN12_GLOBAL__N_110lineBufferE();
    pPVar5 = (PrintBuffer *)_ZTWN12_GLOBAL__N_111printBufferE();
    this_01 = (unique_ptr<yb::ArrowHandler,_std::default_delete<yb::ArrowHandler>_> *)
              _ZTWN12_GLOBAL__N_112arrowHandlerE();
    arrowHandler = std::unique_ptr<yb::ArrowHandler,_std::default_delete<yb::ArrowHandler>_>::
                   operator*(this_01);
    uVar2 = yb::yebash(history,printer,buffer,pPVar5,arrowHandler,*__buf);
    *(uchar *)__buf = uVar2;
  }
  return sVar4;
}

Assistant:

ssize_t read(int fd, void *buf, size_t count) {
    if (is_terminal_input(fd) && !printBuffer.empty()) {
        putCharToReadBuffer(static_cast<char *>(buf));
        return 1;
    }
    auto returnValue = realRead(fd, buf, count);
    if (is_terminal_input(fd)) {
        *static_cast<unsigned char *>(buf) = yb::yebash(*historySuggestion, *printer, lineBuffer, printBuffer, *arrowHandler, *static_cast<unsigned char *>(buf));
    }
    return returnValue;
}